

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O3

void __thiscall MutableBuffer::push<short>(MutableBuffer *this,short value,size_t count)

{
  void *pvVar1;
  size_t sVar2;
  ushort uVar3;
  
  check_size(this,count * 2 + (this->super_Buffer).size);
  if (count != 0) {
    pvVar1 = (this->super_Buffer).data;
    sVar2 = (this->super_Buffer).size;
    uVar3 = value << 8 | (ushort)value >> 8;
    if ((this->super_Buffer).endianess != EndianessBig) {
      uVar3 = value;
    }
    do {
      *(ushort *)((long)pvVar1 + sVar2) = uVar3;
      sVar2 = sVar2 + 2;
      count = count - 1;
    } while (count != 0);
    (this->super_Buffer).size = sVar2;
  }
  return;
}

Assistant:

void push(T value, size_t count = 1) {
    check_size(size + (sizeof(T) * count));
    for (size_t i = 0; i < count; i++) {
      *(reinterpret_cast<T*>(offset(size))) = (endianess == EndianessBig) ?
                                                htobe(value) :
                                                htole(value);
      size += sizeof(T);
    }
  }